

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O3

void gdImageSharpen(gdImagePtr im,int pct)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float outer_coeff;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float inner_coeff;
  
  if ((0 < pct) && (im->trueColor != 0)) {
    iVar2 = im->sx;
    outer_coeff = (float)-pct / 400.0;
    iVar3 = im->sy;
    inner_coeff = 1.0 - (outer_coeff + outer_coeff);
    if (0 < iVar2) {
      iVar7 = 0;
      do {
        iVar4 = gdImageGetPixel(im,iVar7,0);
        if (iVar3 < 2) {
          iVar5 = 0;
        }
        else {
          iVar6 = iVar4;
          iVar8 = 0;
          do {
            iVar4 = gdImageGetPixel(im,iVar7,iVar8);
            iVar1 = iVar8 + 1;
            iVar5 = gdImageGetTrueColorPixel(im,iVar7,iVar1);
            iVar5 = gdImageSubSharpen(iVar6,iVar4,iVar5,inner_coeff,outer_coeff);
            gdImageSetPixel(im,iVar7,iVar8,iVar5);
            iVar6 = iVar4;
            iVar8 = iVar1;
            iVar5 = iVar3 + -1;
          } while (iVar1 != iVar3 + -1);
        }
        iVar6 = gdImageGetPixel(im,iVar7,iVar5);
        iVar4 = gdImageSubSharpen(iVar4,iVar6,iVar6,inner_coeff,outer_coeff);
        gdImageSetPixel(im,iVar7,iVar5,iVar4);
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar2);
    }
    if (0 < iVar3) {
      iVar7 = 0;
      do {
        iVar4 = gdImageGetPixel(im,0,iVar7);
        if (iVar2 < 2) {
          iVar5 = 0;
        }
        else {
          iVar6 = iVar4;
          iVar8 = 0;
          do {
            iVar4 = gdImageGetPixel(im,iVar8,iVar7);
            iVar1 = iVar8 + 1;
            iVar5 = gdImageGetTrueColorPixel(im,iVar1,iVar7);
            iVar5 = gdImageSubSharpen(iVar6,iVar4,iVar5,inner_coeff,outer_coeff);
            gdImageSetPixel(im,iVar8,iVar7,iVar5);
            iVar6 = iVar4;
            iVar8 = iVar1;
            iVar5 = iVar2 + -1;
          } while (iVar1 != iVar2 + -1);
        }
        iVar6 = gdImageGetPixel(im,iVar5,iVar7);
        iVar4 = gdImageSubSharpen(iVar4,iVar6,iVar6,inner_coeff,outer_coeff);
        gdImageSetPixel(im,iVar5,iVar7,iVar4);
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar3);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void)
gdImageSharpen (gdImagePtr im, int pct)
{
	int x, y;
	int sx, sy;
	float inner_coeff, outer_coeff;

	sx = im->sx;
	sy = im->sy;

	/* Must sum to 1 to avoid overall change in brightness.
	 * Scaling chosen so that pct=100 gives 1-D filter [-1 6 -1]/4,
	 * resulting in a 2-D filter [1 -6 1; -6 36 -6; 1 -6 1]/16,
	 * which gives noticeable, but not excessive, sharpening
	 */

	outer_coeff = -pct / 400.0;
	inner_coeff = 1 - 2 * outer_coeff;

	/* Don't try to do anything with non-truecolor images, as
	   pointless,
	   * nor for pct<=0, as small kernel size leads to nasty
	   artefacts when blurring
	 */
	if ((im->trueColor) && (pct > 0)) {

		/* First pass, 1-D convolution column-wise */
		for (x = 0; x < sx; x++) {

			/* pc is colour of previous pixel; c of the
			   current pixel and nc of the next */
			int pc, c, nc;

			/* Replicate edge pixel at image boundary */
			pc = gdImageGetPixel (im, x, 0);

			/* Stop looping before last pixel to avoid
			   conditional within loop */
			for (y = 0; y < sy - 1; y++) {

				c = gdImageGetPixel (im, x, y);

				nc = gdImageGetTrueColorPixel (im, x, y + 1);

				/* Update centre pixel to new colour */
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));

				/* Save original colour of current
				   pixel for next time round */
				pc = c;
			}

			/* Deal with last pixel, replicating current
			   pixel at image boundary */
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}

		/* Second pass, 1-D convolution row-wise */
		for (y = 0; y < sy; y++) {
			int pc, c;
			pc = gdImageGetPixel (im, 0, y);
			for (x = 0; x < sx - 1; x++) {
				int c, nc;
				c = gdImageGetPixel (im, x, y);
				nc = gdImageGetTrueColorPixel (im, x + 1, y);
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));
				pc = c;
			}
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}
	}
}